

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O2

int sparse_file_write_block(output_file *out,backed_block *bb)

{
  backed_block_type bVar1;
  uint uVar2;
  uint32_t fill_val;
  int iVar3;
  void *data;
  int64_t iVar4;
  char *file;
  
  bVar1 = backed_block_type(bb);
  switch(bVar1) {
  case BACKED_BLOCK_DATA:
    uVar2 = backed_block_len(bb);
    data = backed_block_data(bb);
    iVar3 = write_data_chunk(out,uVar2,data);
    return iVar3;
  case BACKED_BLOCK_FILE:
    uVar2 = backed_block_len(bb);
    file = backed_block_filename(bb);
    iVar4 = backed_block_file_offset(bb);
    iVar3 = write_file_chunk(out,uVar2,file,iVar4);
    return iVar3;
  case BACKED_BLOCK_FD:
    uVar2 = backed_block_len(bb);
    iVar3 = backed_block_fd(bb);
    iVar4 = backed_block_file_offset(bb);
    iVar3 = write_fd_chunk(out,uVar2,iVar3,iVar4);
    return iVar3;
  case BACKED_BLOCK_FILL:
    uVar2 = backed_block_len(bb);
    fill_val = backed_block_fill_val(bb);
    iVar3 = write_fill_chunk(out,uVar2,fill_val);
    return iVar3;
  default:
    return -0x16;
  }
}

Assistant:

static int sparse_file_write_block(struct output_file* out, struct backed_block* bb) {
  int ret = -EINVAL;

  switch (backed_block_type(bb)) {
    case BACKED_BLOCK_DATA:
      ret = write_data_chunk(out, backed_block_len(bb), backed_block_data(bb));
      break;
    case BACKED_BLOCK_FILE:
      ret = write_file_chunk(out, backed_block_len(bb), backed_block_filename(bb),
                             backed_block_file_offset(bb));
      break;
    case BACKED_BLOCK_FD:
      ret = write_fd_chunk(out, backed_block_len(bb), backed_block_fd(bb),
                           backed_block_file_offset(bb));
      break;
    case BACKED_BLOCK_FILL:
      ret = write_fill_chunk(out, backed_block_len(bb), backed_block_fill_val(bb));
      break;
  }

  return ret;
}